

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

randomx_dataset * randomx_alloc_dataset(randomx_flags flags)

{
  randomx_flags rVar1;
  randomx_dataset *this;
  uint8_t *puVar2;
  randomx_flags in_EDI;
  exception *ex;
  randomx_dataset *dataset;
  size_t in_stack_ffffffffffffffc0;
  
  this = (randomx_dataset *)operator_new(0x10);
  this->memory = (uint8_t *)0x0;
  this->dealloc = (DatasetDeallocFunc *)0x0;
  randomx_dataset::randomx_dataset(this);
  rVar1 = operator&(in_EDI,RANDOMX_FLAG_LARGE_PAGES);
  if (rVar1 == RANDOMX_FLAG_DEFAULT) {
    this->dealloc = randomx::deallocDataset<randomx::AlignedAllocator<64ul>>;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(in_stack_ffffffffffffffc0);
    this->memory = puVar2;
  }
  else {
    this->dealloc = randomx::deallocDataset<randomx::LargePageAllocator>;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x1218a3);
    this->memory = puVar2;
  }
  return this;
}

Assistant:

randomx_dataset *randomx_alloc_dataset(randomx_flags flags) {

		//fail on 32-bit systems if DatasetSize is >= 4 GiB
		if (randomx::DatasetSize > std::numeric_limits<size_t>::max()) {
			return nullptr;
		}

		randomx_dataset *dataset = nullptr;

		try {
			dataset = new randomx_dataset();
			if (flags & RANDOMX_FLAG_LARGE_PAGES) {
				dataset->dealloc = &randomx::deallocDataset<randomx::LargePageAllocator>;
				dataset->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::DatasetSize);
			}
			else {
				dataset->dealloc = &randomx::deallocDataset<randomx::DefaultAllocator>;
				dataset->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::DatasetSize);
			}
		}
		catch (std::exception &ex) {
			if (dataset != nullptr) {
				randomx_release_dataset(dataset);
				dataset = nullptr;
			}
		}

		return dataset;
	}